

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isdigit.c
# Opt level: O2

int main(void)

{
  ushort **ppuVar1;
  ushort *puVar2;
  
  ppuVar1 = __ctype_b_loc();
  puVar2 = *ppuVar1;
  if ((*(byte *)((long)puVar2 + 0x61) & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isdigit.c, line %d - %s\n"
           ,0x1a,"isdigit( \'0\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0x73) & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isdigit.c, line %d - %s\n"
           ,0x1b,"isdigit( \'9\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0x41) & 8) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isdigit.c, line %d - %s\n"
           ,0x1c,"! isdigit( \' \' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0xc3) & 8) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isdigit.c, line %d - %s\n"
           ,0x1d,"! isdigit( \'a\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0x81) & 8) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isdigit.c, line %d - %s\n"
           ,0x1e,"! isdigit( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isdigit( '0' ) );
    TESTCASE( isdigit( '9' ) );
    TESTCASE( ! isdigit( ' ' ) );
    TESTCASE( ! isdigit( 'a' ) );
    TESTCASE( ! isdigit( '@' ) );
    return TEST_RESULTS;
}